

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged
          (QSortFilterProxyModelPrivate *this,Orientation orientation,int start,int end)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  int *piVar3;
  iterator __last;
  iterator iVar4;
  qsizetype qVar5;
  const_reference piVar6;
  QSortFilterProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int proxyEnd;
  int proxyStart;
  int numItems;
  int last_index;
  QList<int> *source_to_proxy;
  Mapping *m;
  QSortFilterProxyModel *q;
  const_iterator endIt;
  const_iterator it;
  QList<int> proxy_positions;
  undefined4 in_stack_fffffffffffffeb8;
  parameter_type in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  iterator in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  QModelIndex *in_stack_ffffffffffffff00;
  QSortFilterProxyModelPrivate *in_stack_ffffffffffffff08;
  int local_dc;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int local_cc;
  const_iterator local_50;
  QList<int> local_48 [2];
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QModelIndex::QModelIndex((QModelIndex *)0x8739d0);
  local_18 = (piter)create_mapping(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::const_iterator::
  value((const_iterator *)0x8739ff);
  local_48[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48[0].d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x873a8a);
  QList<int>::reserve((QList<int> *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_50.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::constBegin
            ((QList<int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_50 = QList<int>::const_iterator::operator+
                       ((const_iterator *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  QList<int>::constBegin
            ((QList<int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  QList<int>::const_iterator::operator+
            ((const_iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  o = QList<int>::const_iterator::operator+
                ((const_iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  while (bVar1 = QList<int>::const_iterator::operator!=(&local_50,o), bVar1) {
    piVar3 = QList<int>::const_iterator::operator*(&local_50);
    if (*piVar3 != -1) {
      in_stack_fffffffffffffed8.i = QList<int>::const_iterator::operator*(&local_50);
      QList<int>::push_back
                ((QList<int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
    }
    QList<int>::const_iterator::operator++(&local_50);
  }
  __last = QList<int>::begin((QList<int> *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  iVar4 = QList<int>::end((QList<int> *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::sort<QList<int>::iterator>(in_stack_fffffffffffffed8,__last);
  local_cc = 0;
  qVar5 = QList<int>::size(local_48);
  while (local_cc < (int)qVar5) {
    piVar6 = QList<int>::at((QList<int> *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    iVar2 = *piVar6;
    local_dc = local_cc + 1;
    local_cc = local_dc;
    while ((local_dc < (int)qVar5 &&
           (piVar6 = QList<int>::at((QList<int> *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
           *piVar6 == iVar2 + 1))) {
      local_cc = local_cc + 1;
      iVar2 = iVar2 + 1;
      local_dc = local_dc + 1;
    }
    QAbstractItemModel::headerDataChanged
              ((QAbstractItemModel *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (Orientation)((ulong)iVar4.i >> 0x20),(int)iVar4.i,in_stack_fffffffffffffec4);
  }
  QList<int>::~QList((QList<int> *)0x873d68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged(Qt::Orientation orientation,
                                                           int start, int end)
{
    Q_ASSERT(start <= end);

    Q_Q(QSortFilterProxyModel);
    Mapping *m = create_mapping(QModelIndex()).value();

    const QList<int> &source_to_proxy = (orientation == Qt::Vertical) ? m->proxy_rows : m->proxy_columns;

    QList<int> proxy_positions;
    proxy_positions.reserve(end - start + 1);
    {
        Q_ASSERT(source_to_proxy.size() > end);
        QList<int>::const_iterator it = source_to_proxy.constBegin() + start;
        const QList<int>::const_iterator endIt = source_to_proxy.constBegin() + end + 1;
        for ( ; it != endIt; ++it) {
            if (*it != -1)
                proxy_positions.push_back(*it);
        }
    }

    std::sort(proxy_positions.begin(), proxy_positions.end());

    int last_index = 0;
    const int numItems = proxy_positions.size();
    while (last_index < numItems) {
        const int proxyStart = proxy_positions.at(last_index);
        int proxyEnd = proxyStart;
        ++last_index;
        for (int i = last_index; i < numItems; ++i) {
            if (proxy_positions.at(i) == proxyEnd + 1) {
                ++last_index;
                ++proxyEnd;
            } else {
                break;
            }
        }
        emit q->headerDataChanged(orientation, proxyStart, proxyEnd);
    }
}